

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O2

void __thiscall adios2::profiling::Timer::AddToJsonStr(Timer *this,string *rankLog,bool addComma)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (this->m_nCalls != 0) {
    if (addComma) {
      std::__cxx11::string::append((char *)rankLog);
    }
    std::operator+(&local_38,"\"",&this->m_Process);
    std::operator+(&local_78,&local_38,"\":{\"mus\":");
    std::__cxx11::to_string(&local_58,this->m_ProcessTime);
    std::operator+(&bStack_98,&local_78,&local_58);
    std::__cxx11::string::append((string *)rankLog);
    std::__cxx11::string::~string((string *)&bStack_98);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::to_string(&local_78,this->m_nCalls);
    std::operator+(&bStack_98,", \"nCalls\":",&local_78);
    std::__cxx11::string::append((string *)rankLog);
    std::__cxx11::string::~string((string *)&bStack_98);
    std::__cxx11::string::~string((string *)&local_78);
    if ((this->m_nCalls < 500) && (2 < (this->m_Details)._M_string_length)) {
      std::operator+(&local_78,", \"trace\":[",&this->m_Details);
      std::operator+(&bStack_98,&local_78,"]");
      std::__cxx11::string::append((string *)rankLog);
      std::__cxx11::string::~string((string *)&bStack_98);
      std::__cxx11::string::~string((string *)&local_78);
    }
    std::__cxx11::string::append((char *)rankLog);
  }
  return;
}

Assistant:

void AddToJsonStr(std::string &rankLog, const bool addComma = true) const
    {
        if (0 == m_nCalls)
            return;

        if (addComma)
        {
            rankLog += ", ";
        }
        rankLog += "\"" + m_Process + "\":{\"mus\":" + std::to_string(m_ProcessTime);
        rankLog += ", \"nCalls\":" + std::to_string(m_nCalls);

        if (500 > m_nCalls)
        {
            if (m_Details.size() > 2)
            {
                rankLog += ", \"trace\":[" + m_Details + "]";
            }
        }
        rankLog += "}";
    }